

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O1

void wavread(char *filename,int *fs,int *nbit,double *x)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  undefined4 *unaff_R13;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  uchar for_int_number [4];
  undefined4 local_6c;
  char local_68;
  byte abStack_65 [9];
  int local_5c;
  ulong local_58;
  int *local_50;
  byte *local_48;
  double local_40;
  double *local_38;
  
  local_38 = x;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puts("File not found.");
    return;
  }
  iVar4 = anon_unknown.dwarf_8cd2::CheckHeader((FILE *)__stream);
  if (iVar4 != 0) {
    uVar8 = 0;
    local_6c = 0;
    local_68 = '\0';
    lVar9 = 4;
    fread(abStack_65 + 1,1,4,__stream);
    *fs = 0;
    do {
      uVar8 = (uint)abStack_65[lVar9] | uVar8 << 8;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    *fs = uVar8;
    fseek(__stream,6,1);
    fread(abStack_65 + 1,1,2,__stream);
    *nbit = (uint)abStack_65[1];
    sVar5 = fread(&local_6c,1,1,__stream);
    if (sVar5 != 0) {
      unaff_R13 = &local_6c;
      do {
        if ((char)local_6c == 'd') {
          fread((void *)((long)&local_6c + 1),1,3,__stream);
          if (local_68 == '\0' && local_6c == 0x61746164) break;
          fseek(__stream,-3,1);
        }
        sVar5 = fread(unaff_R13,1,1,__stream);
      } while (sVar5 != 0);
    }
    uVar8 = (uint)unaff_R13;
    bVar2 = local_68 == '\0';
    bVar3 = local_6c == 0x61746164;
    if (bVar2 && bVar3) {
      lVar9 = 4;
      fread(abStack_65 + 1,1,4,__stream);
      uVar8 = 0;
      do {
        uVar8 = (uint)abStack_65[lVar9] | uVar8 << 8;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
      iVar4 = *nbit;
      iVar7 = iVar4 + 7;
      if (-1 < iVar4) {
        iVar7 = iVar4;
      }
      uVar8 = (int)uVar8 / (iVar7 >> 3);
    }
    else {
      puts("data error.");
    }
    if (bVar2 && bVar3) {
      local_58 = (ulong)(uint)*nbit;
      local_50 = nbit;
      local_40 = ldexp(1.0,*nbit - 1);
      if (0 < (int)uVar8) {
        iVar4 = (int)local_58;
        local_5c = iVar4 + 7;
        if (-1 < iVar4) {
          local_5c = iVar4;
        }
        local_5c = local_5c >> 3;
        sVar5 = (size_t)local_5c;
        local_48 = abStack_65 + (sVar5 - 1 & 0xffffffff) + 5;
        uVar10 = 0;
        do {
          fread(abStack_65 + 5,1,sVar5,__stream);
          bVar1 = abStack_65[sVar5 + 4];
          dVar11 = 0.0;
          if ((char)bVar1 < '\0') {
            dVar11 = ldexp(1.0,*local_50 + -1);
            abStack_65[sVar5 + 4] = bVar1 & 0x7f;
          }
          dVar12 = 0.0;
          pbVar6 = local_48;
          iVar4 = local_5c;
          if (7 < (int)local_58) {
            do {
              dVar12 = dVar12 * 256.0 + (double)*pbVar6;
              iVar7 = iVar4 + -1;
              bVar2 = 0 < iVar4;
              pbVar6 = pbVar6 + -1;
              iVar4 = iVar7;
            } while (iVar7 != 0 && bVar2);
          }
          local_38[uVar10] = (dVar12 - dVar11) / local_40;
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar8);
      }
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void wavread(const char* filename, int *fs, int *nbit, double *x) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File not found.\n");
    return;
  }

  if (0 == CheckHeader(fp)) {
    fclose(fp);
    return;
  }

  int x_length;
  if (0 == GetParameters(fp, fs, nbit, &x_length)) {
    fclose(fp);
    return;
  }

  int quantization_byte = *nbit / 8;
  double zero_line = pow(2.0, *nbit - 1);
  double tmp, sign_bias;
  unsigned char for_int_number[4];
  for (int i = 0; i < x_length; ++i) {
    sign_bias = tmp = 0.0;
    fread(for_int_number, 1, quantization_byte, fp);  // "data"
    if (for_int_number[quantization_byte-1] >= 128) {
      sign_bias = pow(2.0, *nbit - 1);
      for_int_number[quantization_byte - 1] =
        for_int_number[quantization_byte - 1] & 0x7F;
    }
    for (int j = quantization_byte - 1; j >= 0; --j)
      tmp = tmp * 256.0 + for_int_number[j];
    x[i] = (tmp - sign_bias) / zero_line;
  }
  fclose(fp);
}